

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

void commit_h(uint8_t *digest,commitments_t *C,picnic_instance_t *params)

{
  size_t i;
  ulong uVar1;
  hash_context ctx;
  hash_context hStack_108;
  
  hash_init(&hStack_108,(ulong)params->digest_size);
  for (uVar1 = 0; uVar1 < params->num_MPC_parties; uVar1 = uVar1 + 1) {
    hash_update(&hStack_108,C->hashes[uVar1],(ulong)params->digest_size);
  }
  hash_final(&hStack_108);
  hash_squeeze(&hStack_108,digest,(ulong)params->digest_size);
  return;
}

Assistant:

static void commit_h(uint8_t* digest, const commitments_t* C, const picnic_instance_t* params) {
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    hash_update(&ctx, C->hashes[i], params->digest_size);
  }
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, params->digest_size);
  hash_clear(&ctx);
}